

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::TextureWrapCase::iterate(TextureWrapCase *this)

{
  code *pcVar1;
  RenderContext *pRVar2;
  int y;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  char *pcVar8;
  undefined4 extraout_var_01;
  PixelFormat *pPVar9;
  reference pvVar10;
  undefined4 extraout_var_02;
  Texture2D *pTVar11;
  undefined4 extraout_var_03;
  Texture2DView TVar12;
  undefined1 local_240 [7];
  bool isOk;
  ConstPixelBufferAccess *local_238;
  SurfaceAccess local_230;
  PixelBufferAccess local_210;
  Vector<float,_2> local_1e8;
  Vector<float,_2> local_1e0;
  Texture2DView local_1d8;
  SurfaceAccess local_1c8;
  PixelBufferAccess local_1a8;
  Vector<float,_2> local_180;
  Vector<float,_2> local_178;
  Sampler local_170;
  RGBA local_134;
  RGBA local_130;
  RGBA local_12c;
  undefined1 local_128 [4];
  RGBA threshold;
  vector<float,_std::allocator<float>_> texCoord;
  int rightWidth;
  int leftWidth;
  ReferenceParams refParams;
  bool isCompressedTex;
  undefined1 local_60 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  TextureWrapCase *this_local;
  long lVar7;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar8 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),0x100,0x100,dVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_60,viewport.x,viewport.y);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_filenames);
  refParams.baseLevel._3_1_ = !bVar3;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)&rightWidth,TEXTURETYPE_2D);
  iVar4 = viewport.x / 2;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_128);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar6));
  local_130 = tcu::PixelFormat::getColorThreshold(pPVar9);
  if ((refParams.baseLevel._3_1_ & 1) == 0) {
    tcu::RGBA::RGBA(&local_134,3,3,3,3);
  }
  else {
    tcu::RGBA::RGBA(&local_134,7,7,7,7);
  }
  local_12c = tcu::operator+(&local_130,&local_134);
  (**(code **)(lVar7 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar7 + 0xb8);
  dVar5 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar5);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,this->m_magFilter);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureWrapTests.cpp"
                  ,0xb9);
  glu::mapGLSampler(&local_170,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_170)
  ;
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  (**(code **)(lVar7 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,iVar4,viewport.y);
  tcu::Vector<float,_2>::Vector(&local_178,-1.5,-3.0);
  tcu::Vector<float,_2>::Vector(&local_180,1.5,2.5);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_128,&local_178,&local_180);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_128,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar10,(RenderParams *)&rightWidth);
  y = renderedFrame.m_pixels.m_cap._4_4_;
  iVar6 = (int)renderedFrame.m_pixels.m_cap;
  pRVar2 = this->m_renderCtx;
  tcu::Surface::getAccess(&local_1a8,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar2,iVar6,y,&local_1a8);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar6));
  tcu::SurfaceAccess::SurfaceAccess(&local_1c8,(Surface *)local_60,pPVar9,0,0,iVar4,viewport.y);
  pTVar11 = glu::Texture2D::getRefTexture(this->m_texture);
  TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar11);
  local_1d8.m_levels = TVar12.m_levels;
  local_1d8.m_numLevels = TVar12.m_numLevels;
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_128,0);
  glu::TextureTestUtil::sampleTexture(&local_1c8,&local_1d8,pvVar10,(ReferenceParams *)&rightWidth);
  (**(code **)(lVar7 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap + iVar4,renderedFrame.m_pixels.m_cap._4_4_,
             viewport.x - iVar4,viewport.y);
  tcu::Vector<float,_2>::Vector(&local_1e0,-0.5,0.75);
  tcu::Vector<float,_2>::Vector(&local_1e8,0.25,1.25);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_128,&local_1e0,&local_1e8);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_128,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar10,(RenderParams *)&rightWidth);
  pRVar2 = this->m_renderCtx;
  tcu::Surface::getAccess(&local_210,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(pRVar2,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_210);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar9 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar6));
  tcu::SurfaceAccess::SurfaceAccess
            (&local_230,(Surface *)local_60,pPVar9,iVar4,0,viewport.x - iVar4,viewport.y);
  pTVar11 = glu::Texture2D::getRefTexture(this->m_texture);
  TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar11);
  local_238 = TVar12.m_levels;
  local_240._0_4_ = TVar12.m_numLevels;
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_128,0);
  glu::TextureTestUtil::sampleTexture
            (&local_230,(Texture2DView *)local_240,pvVar10,(ReferenceParams *)&rightWidth);
  bVar3 = glu::TextureTestUtil::compareImages
                    (log_00,(Surface *)local_60,(Surface *)&referenceFrame.m_pixels.m_cap,local_12c)
  ;
  pcVar8 = "Image comparison failed";
  if (bVar3) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(byte)~bVar3 & QP_TEST_RESULT_FAIL,
             pcVar8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_128);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

TextureWrapCase::IterateResult TextureWrapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	bool					isCompressedTex		= !m_filenames.empty();
	ReferenceParams			refParams			(TEXTURETYPE_2D);
	int						leftWidth			= viewport.width / 2;
	int						rightWidth			= viewport.width - leftWidth;
	vector<float>			texCoord;
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()
												+ (isCompressedTex ? tcu::RGBA(7,7,7,7) : tcu::RGBA(3,3,3,3));

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup filtering and wrap modes.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Parameters for reference images.
	refParams.sampler	= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.lodMode	= LODMODE_EXACT;

	// Left: minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-1.5f, -3.0f), tcu::Vec2(1.5f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Right: magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}